

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O3

FT_Error ps_mask_table_alloc(PS_Mask_Table table,FT_Memory memory,PS_Mask *amask)

{
  uint uVar1;
  PS_Mask pPVar2;
  FT_Error FVar3;
  uint uVar4;
  FT_Error local_34;
  
  uVar1 = table->num_masks + 1;
  if (table->max_masks < uVar1) {
    local_34 = 0;
    uVar4 = (table->num_masks & 0xfffffff8) + 8;
    pPVar2 = (PS_Mask)ft_mem_realloc(memory,0x18,(ulong)table->max_masks,(ulong)uVar4,table->masks,
                                     &local_34);
    table->masks = pPVar2;
    if (local_34 != 0) {
      pPVar2 = (PS_Mask)0x0;
      FVar3 = local_34;
      goto LAB_0023998d;
    }
    table->max_masks = uVar4;
  }
  else {
    pPVar2 = table->masks;
  }
  FVar3 = 0;
  pPVar2[(ulong)uVar1 - 1].num_bits = 0;
  pPVar2[(ulong)uVar1 - 1].end_point = 0;
  if (pPVar2[(ulong)uVar1 - 1].max_bits != 0) {
    memset(pPVar2[(ulong)uVar1 - 1].bytes,0,(ulong)(pPVar2[(ulong)uVar1 - 1].max_bits >> 3));
  }
  pPVar2 = pPVar2 + ((ulong)uVar1 - 1);
  table->num_masks = uVar1;
LAB_0023998d:
  *amask = pPVar2;
  return FVar3;
}

Assistant:

static FT_Error
  ps_mask_table_alloc( PS_Mask_Table  table,
                       FT_Memory      memory,
                       PS_Mask       *amask )
  {
    FT_UInt   count;
    FT_Error  error = FT_Err_Ok;
    PS_Mask   mask  = NULL;


    count = table->num_masks;
    count++;

    if ( count > table->max_masks )
    {
      error = ps_mask_table_ensure( table, count, memory );
      if ( error )
        goto Exit;
    }

    mask             = table->masks + count - 1;
    mask->num_bits   = 0;
    mask->end_point  = 0;
    /* reused mask must be cleared */
    if ( mask->max_bits )
      FT_MEM_ZERO( mask->bytes, mask->max_bits >> 3 );

    table->num_masks = count;

  Exit:
    *amask = mask;
    return error;
  }